

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

UBool __thiscall icu_63::Calendar::isEquivalentTo(Calendar *this,Calendar *other)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = std::type_info::operator==
                    ((type_info *)(this->super_UObject)._vptr_UObject[-1],
                     (type_info *)(other->super_UObject)._vptr_UObject[-1]);
  if ((((((bVar1) && (this->fLenient == other->fLenient)) &&
        (this->fRepeatedWallTime == other->fRepeatedWallTime)) &&
       ((this->fSkippedWallTime == other->fSkippedWallTime &&
        (this->fFirstDayOfWeek == other->fFirstDayOfWeek)))) &&
      ((this->fMinimalDaysInFirstWeek == other->fMinimalDaysInFirstWeek &&
       ((this->fWeekendOnset == other->fWeekendOnset &&
        (this->fWeekendOnsetMillis == other->fWeekendOnsetMillis)))))) &&
     ((this->fWeekendCease == other->fWeekendCease &&
      (this->fWeekendCeaseMillis == other->fWeekendCeaseMillis)))) {
    iVar2 = (*(this->fZone->super_UObject)._vptr_UObject[3])(this->fZone,other->fZone);
    bVar1 = (char)iVar2 != '\0';
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

UBool
Calendar::isEquivalentTo(const Calendar& other) const
{
    return typeid(*this) == typeid(other) &&
        fLenient                == other.fLenient &&
        fRepeatedWallTime       == other.fRepeatedWallTime &&
        fSkippedWallTime        == other.fSkippedWallTime &&
        fFirstDayOfWeek         == other.fFirstDayOfWeek &&
        fMinimalDaysInFirstWeek == other.fMinimalDaysInFirstWeek &&
        fWeekendOnset           == other.fWeekendOnset &&
        fWeekendOnsetMillis     == other.fWeekendOnsetMillis &&
        fWeekendCease           == other.fWeekendCease &&
        fWeekendCeaseMillis     == other.fWeekendCeaseMillis &&
        *fZone                  == *other.fZone;
}